

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles3::Stress::(anonymous_namespace)::VertexAttributeCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = *(int *)((long)this + 0x88);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (iVar1 == 0) {
    pcVar3 = 
    "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_out;\nvoid main ()\n{\n\tfragColor = v_out;\n}\n"
    ;
    pcVar2 = "";
  }
  else {
    pcVar3 = 
    "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;\nin highp vec4 v_attr;\nvoid main ()\n{\n\thighp vec2 a1 = v_attr.xz + v_attr.yw; // add\n\thighp vec2 a2 = v_attr.xz - v_attr.yw; // sub\n\thighp vec2 a3 = v_attr.xz * v_attr.yw; // mul\n\thighp vec2 a4 = v_attr.xz / v_attr.yw; // div\n\thighp vec2 a5 = v_attr.xz + v_attr.yw * v_attr.xz; // fma\n\thighp vec2 a6 = dFdx(v_attr.xz);\n\n\thighp float green = 1.0 - abs((a1.y + a2.y + a3.y + a4.y + a5.y + a6.y) - 6.0);\n\tfragColor = vec4(a1.x*a3.x + a2.x*a4.x, green, a5.x+a6.x, 1.0);\n}\n"
    ;
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string VertexAttributeCase::genFragmentSource (void) const
{
	if (m_type == TYPE_VERTEX)
		return s_colorPassthroughFragmentShaderSource;
	else
		return
			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;\n"
			"in highp vec4 v_attr;\n"
			"void main ()\n"
			"{\n"
			"	highp vec2 a1 = v_attr.xz + v_attr.yw; // add\n"
			"	highp vec2 a2 = v_attr.xz - v_attr.yw; // sub\n"
			"	highp vec2 a3 = v_attr.xz * v_attr.yw; // mul\n"
			"	highp vec2 a4 = v_attr.xz / v_attr.yw; // div\n"
			"	highp vec2 a5 = v_attr.xz + v_attr.yw * v_attr.xz; // fma\n"
			"	highp vec2 a6 = dFdx(v_attr.xz);\n"
			"\n"
			"	highp float green = 1.0 - abs((a1.y + a2.y + a3.y + a4.y + a5.y + a6.y) - 6.0);\n"
			"	fragColor = vec4(a1.x*a3.x + a2.x*a4.x, green, a5.x+a6.x, 1.0);\n"
			"}\n";
}